

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.h
# Opt level: O2

void __thiscall UnifiedRegex::AltNode::AltNode(AltNode *this,Node *head,AltNode *tail)

{
  Node::Node(&this->super_Node,Alt);
  (this->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_013dfbf0;
  this->head = head;
  this->tail = tail;
  this->runtimeTrie = (RuntimeCharTrie *)0x0;
  this->scheme = Try;
  this->isOptional = false;
  this->switchSize = 0;
  return;
}

Assistant:

inline AltNode(Node* head, AltNode* tail)
            : Node(Alt)
            , head(head)
            , tail(tail)
            , scheme(Try)
            , runtimeTrie(0)
            , isOptional(false)
            , switchSize(0)
        {
        }